

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RevoluteJoint.cpp
# Opt level: O0

void __thiscall
iDynTree::RevoluteJoint::computeChildBiasAcc
          (RevoluteJoint *this,VectorDynSize *jntPos,VectorDynSize *jntVel,LinkVelArray *linkVels,
          LinkAccArray *linkBiasAccs,LinkIndex child,LinkIndex parent)

{
  ulong uVar1;
  Twist *pTVar2;
  SpatialAcc *pSVar3;
  VectorDynSize *in_RDX;
  undefined8 in_RSI;
  LinkAccArray *in_RDI;
  undefined8 in_R9;
  undefined8 in_stack_00000008;
  SpatialMotionVector vj;
  SpatialMotionVector S;
  Transform *parent_X_child;
  Transform *child_X_parent;
  double dang;
  Twist local_168 [48];
  Twist local_138 [48];
  SpatialAcc local_108;
  SpatialAcc local_d8;
  SpatialMotionVector local_a8;
  undefined1 local_78 [48];
  undefined8 local_48;
  SpatialAcc *local_40;
  double local_38;
  undefined8 local_30;
  undefined8 local_10;
  
  local_30 = in_R9;
  local_10 = in_RSI;
  uVar1 = (**(code **)&(in_RDI->m_linkAcc).
                       super__Vector_base<iDynTree::SpatialAcc,_std::allocator<iDynTree::SpatialAcc>_>
                       ._M_impl.super__Vector_impl_data._M_start[4].super_SpatialMotionVector.
                       super_SpatialVector<iDynTree::SpatialMotionVector>)();
  local_38 = (double)iDynTree::VectorDynSize::operator()(in_RDX,uVar1);
  local_40 = (SpatialAcc *)
             (**(code **)((long)&(in_RDI->m_linkAcc).
                                 super__Vector_base<iDynTree::SpatialAcc,_std::allocator<iDynTree::SpatialAcc>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].
                                 super_SpatialMotionVector.
                                 super_SpatialVector<iDynTree::SpatialMotionVector> + 0x20))
                       (in_RDI,local_10,local_30,in_stack_00000008);
  local_48 = (**(code **)((long)&(in_RDI->m_linkAcc).
                                 super__Vector_base<iDynTree::SpatialAcc,_std::allocator<iDynTree::SpatialAcc>_>
                                 ._M_impl.super__Vector_impl_data._M_start[1].
                                 super_SpatialMotionVector.
                                 super_SpatialVector<iDynTree::SpatialMotionVector> + 0x20))
                       (in_RDI,local_10,in_stack_00000008,local_30);
  (**(code **)&(in_RDI->m_linkAcc).
               super__Vector_base<iDynTree::SpatialAcc,_std::allocator<iDynTree::SpatialAcc>_>.
               _M_impl.super__Vector_impl_data._M_start[2].super_SpatialMotionVector.
               super_SpatialVector<iDynTree::SpatialMotionVector>)
            (local_78,in_RDI,0,local_30,LINK_INVALID_INDEX);
  iDynTree::SpatialMotionVector::operator*(&local_a8,local_38);
  pSVar3 = local_40;
  LinkAccArray::operator()(in_RDI,(LinkIndex)in_RDX);
  iDynTree::Transform::operator*((Transform *)&local_108,pSVar3);
  pTVar2 = LinkVelArray::operator()((LinkVelArray *)in_RDI,(LinkIndex)in_RDX);
  iDynTree::Twist::Twist(local_168,&local_a8);
  iDynTree::Twist::operator*(local_138,pTVar2);
  iDynTree::SpatialAcc::operator+(&local_d8,&local_108);
  pSVar3 = LinkAccArray::operator()(in_RDI,(LinkIndex)in_RDX);
  iDynTree::SpatialAcc::operator=(pSVar3,&local_d8);
  return;
}

Assistant:

void RevoluteJoint::computeChildBiasAcc(const VectorDynSize &jntPos,
                                        const VectorDynSize &jntVel,
                                        const LinkVelArray &linkVels,
                                              LinkAccArray &linkBiasAccs,
                                         const LinkIndex child, const LinkIndex parent) const
{
    double dang = jntVel(this->getDOFsOffset());
    const Transform & child_X_parent = this->getTransform(jntPos,child,parent);
    const Transform & parent_X_child = this->getTransform(jntPos,parent,child);
    iDynTree::SpatialMotionVector S = this->getMotionSubspaceVector(0,child);
    SpatialMotionVector vj = S*dang;
    linkBiasAccs(child) = child_X_parent*linkBiasAccs(parent) + linkVels(child)*vj;
}